

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha2_provider.hpp
# Opt level: O1

void __thiscall
digestpp::detail::sha2_provider<unsigned_long,_0UL>::transform
          (sha2_provider<unsigned_long,_0UL> *this,uchar *data,size_t num_blks)

{
  ulong uVar1;
  unsigned_long uVar2;
  unsigned_long uVar3;
  int i;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  size_t sVar7;
  ulong uVar8;
  ulong uVar9;
  unsigned_long uVar10;
  long lVar11;
  unsigned_long uVar12;
  ulong uVar13;
  unsigned_long uVar14;
  unsigned_long uVar15;
  ulong *puVar16;
  ulong uVar17;
  ulong *puVar18;
  ulong uVar19;
  unsigned_long uVar20;
  ulong uVar21;
  unsigned_long uVar22;
  ulong uVar23;
  unsigned_long uVar24;
  ulong uVar25;
  unsigned_long uVar26;
  unsigned_long W [80];
  ulong local_338 [16];
  ulong local_2b8 [81];
  
  if (num_blks != 0) {
    uVar9 = (this->H)._M_elems[0];
    uVar24 = (this->H)._M_elems[1];
    uVar22 = (this->H)._M_elems[2];
    uVar15 = (this->H)._M_elems[3];
    uVar10 = (this->H)._M_elems[4];
    uVar20 = (this->H)._M_elems[5];
    uVar5 = (this->H)._M_elems[6];
    uVar6 = (this->H)._M_elems[7];
    sVar7 = 0;
    do {
      lVar4 = 0;
      do {
        uVar8 = *(ulong *)(data + lVar4 * 8);
        local_338[lVar4] =
             uVar8 >> 0x38 | (uVar8 & 0xff000000000000) >> 0x28 | (uVar8 & 0xff0000000000) >> 0x18 |
             (uVar8 & 0xff00000000) >> 8 | (uVar8 & 0xff000000) << 8 | (uVar8 & 0xff0000) << 0x18 |
             (uVar8 & 0xff00) << 0x28 | uVar8 << 0x38;
        lVar4 = lVar4 + 1;
      } while (lVar4 != 0x10);
      lVar11 = 0x10;
      puVar16 = local_338;
      puVar18 = local_338 + 0x10;
      for (lVar4 = 0x10; lVar4 != 0; lVar4 = lVar4 + -1) {
        *puVar18 = *puVar16;
        puVar16 = puVar16 + 1;
        puVar18 = puVar18 + 1;
      }
      do {
        uVar8 = local_338[lVar11 + 0xe];
        uVar13 = local_338[lVar11 + 1];
        local_338[lVar11 + 0x10] =
             (uVar8 >> 6 ^ (uVar8 << 3 | uVar8 >> 0x3d) ^ (uVar8 << 0x2d | uVar8 >> 0x13)) +
             local_338[lVar11 + 9] + local_338[lVar11] +
             (uVar13 >> 7 ^
             (uVar13 << 0x38 | uVar13 >> 8) ^ (uVar13 >> 1 | (ulong)((uVar13 & 1) != 0) << 0x3f));
        lVar11 = lVar11 + 1;
      } while (lVar11 != 0x50);
      lVar4 = 0;
      uVar8 = uVar6;
      uVar13 = uVar9;
      uVar14 = uVar15;
      uVar1 = uVar5;
      uVar2 = uVar20;
      uVar3 = uVar22;
      uVar12 = uVar24;
      uVar26 = uVar10;
      do {
        uVar25 = uVar26;
        uVar23 = uVar12;
        uVar21 = uVar3;
        uVar19 = uVar2;
        uVar17 = uVar1;
        uVar12 = uVar13;
        lVar11 = (~uVar25 & uVar17) + (uVar19 & uVar25) + uVar8 +
                 ((uVar25 << 0x17 | uVar25 >> 0x29) ^
                 (uVar25 << 0x2e | uVar25 >> 0x12) ^ (uVar25 << 0x32 | uVar25 >> 0xe)) +
                 *(long *)((long)&sha512_constants<void>::K + lVar4) +
                 *(long *)((long)local_338 + lVar4 + 0x80);
        uVar26 = uVar14 + lVar11;
        uVar13 = (uVar21 & uVar23 ^ (uVar21 ^ uVar23) & uVar12) +
                 ((uVar12 << 0x19 | uVar12 >> 0x27) ^
                 (uVar12 << 0x1e | uVar12 >> 0x22) ^ (uVar12 << 0x24 | uVar12 >> 0x1c)) + lVar11;
        lVar4 = lVar4 + 8;
        uVar8 = uVar17;
        uVar14 = uVar21;
        uVar1 = uVar19;
        uVar2 = uVar25;
        uVar3 = uVar23;
      } while (lVar4 != 0x280);
      uVar9 = uVar9 + uVar13;
      uVar24 = uVar24 + uVar12;
      uVar22 = uVar22 + uVar23;
      uVar15 = uVar15 + uVar21;
      uVar10 = uVar10 + uVar26;
      uVar20 = uVar20 + uVar25;
      uVar5 = uVar5 + uVar19;
      uVar6 = uVar6 + uVar17;
      (this->H)._M_elems[0] = uVar9;
      (this->H)._M_elems[1] = uVar24;
      (this->H)._M_elems[2] = uVar22;
      (this->H)._M_elems[3] = uVar15;
      (this->H)._M_elems[4] = uVar10;
      (this->H)._M_elems[5] = uVar20;
      (this->H)._M_elems[6] = uVar5;
      (this->H)._M_elems[7] = uVar6;
      sVar7 = sVar7 + 1;
      data = data + 0x80;
    } while (sVar7 != num_blks);
  }
  return;
}

Assistant:

inline void transform(const unsigned char* data, size_t num_blks)
	{
		for (size_t blk = 0; blk < num_blks; blk++)
		{
			T M[16];
			for (int i = 0; i < 16; i++)
				M[i] = byteswap(reinterpret_cast<const T*>(data)[blk * 16 + i]);

			const int rounds = N == 512 ? 80 : 64;
			T W[rounds];
			for (int t = 0; t <= 15; t++)
				W[t] = M[t];
			for (int t = 16; t < rounds; t++)
				W[t] = sha2_functions::sigma1(W[t - 2]) + W[t - 7] + sha2_functions::sigma0(W[t - 15]) + W[t - 16];

			T a = H[0];
			T b = H[1];
			T c = H[2];
			T d = H[3];
			T e = H[4];
			T f = H[5];
			T g = H[6];
			T h = H[7];

			for (int t = 0; t < rounds; t++)
			{
				T T1 = h + sha2_functions::sum1(e) + sha2_functions::Ch(e, f, g) + getK(t) + W[t];
				T T2 = sha2_functions::sum0(a) + sha2_functions::Maj(a, b, c);
				h = g;
				g = f;
				f = e;
				e = d + T1;
				d = c;
				c = b;
				b = a;
				a = T1 + T2;

			}
			H[0] += a;
			H[1] += b;
			H[2] += c;
			H[3] += d;
			H[4] += e;
			H[5] += f;
			H[6] += g;
			H[7] += h;
		}

	}